

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_helper.cpp
# Opt level: O2

string * duckdb::KeywordHelper::WriteQuoted(string *__return_storage_ptr__,string *text,char quote)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct((ulong)&local_78,'\x01');
  EscapeQuotes(&local_58,text,quote);
  ::std::operator+(&local_38,&local_78,&local_58);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  ::std::__cxx11::string::_M_construct((ulong)&local_98,'\x01');
  ::std::operator+(__return_storage_ptr__,&local_38,&local_98);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  return __return_storage_ptr__;
}

Assistant:

string KeywordHelper::WriteQuoted(const string &text, char quote) {
	// 1. Escapes all occurences of 'quote' by doubling them (escape in SQL)
	// 2. Adds quotes around the string
	return string(1, quote) + EscapeQuotes(text, quote) + string(1, quote);
}